

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# random.cpp
# Opt level: O1

int8_t __thiscall wasm::Random::get(Random *this)

{
  pointer pcVar1;
  size_t sVar2;
  
  pcVar1 = (this->bytes).super__Vector_base<char,_std::allocator<char>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (this->pos ==
      (long)(this->bytes).super__Vector_base<char,_std::allocator<char>_>._M_impl.
            super__Vector_impl_data._M_finish - (long)pcVar1) {
    this->finishedInput = true;
    this->pos = 0;
    this->xorFactor = this->xorFactor + 1;
  }
  sVar2 = this->pos;
  this->pos = sVar2 + 1;
  return pcVar1[sVar2] ^ (byte)this->xorFactor;
}

Assistant:

int8_t Random::get() {
  if (pos == bytes.size()) {
    // We ran out of input; go back to the start for more.
    finishedInput = true;
    pos = 0;
    xorFactor++;
  }
  return bytes[pos++] ^ xorFactor;
}